

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  long *plVar1;
  undefined8 uVar2;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  size_t sVar5;
  deUint64 *pdVar6;
  long *plVar7;
  int *piVar8;
  size_type __n;
  long lVar9;
  ulong uVar10;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_228 [16];
  pointer local_218;
  VkAllocationCallbacks *pVStack_210;
  Handle<(vk::HandleType)11> local_208;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_200;
  VkDevice local_1e8;
  DeviceInterface *local_1e0;
  ulong local_1d8;
  Move<vk::Handle<(vk::HandleType)11>_> local_1d0;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  sVar3 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_1d8 = (ulong)context >> 0x20;
  local_208.m_internal._0_4_ = 0xb;
  DStack_200.m_deviceIface = (DeviceInterface *)0x0;
  DStack_200.m_device = (VkDevice)((long)context << 0x20);
  DStack_200.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(params.queryType,(int)((ulong)context >> 0x20));
  ::vk::createQueryPool(&local_1d0,vk,device,(VkQueryPoolCreateInfo *)&local_208,local_1a8);
  local_228._0_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  local_228._8_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  local_218 = (pointer)local_1d0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                       m_device;
  pVStack_210 = local_1d0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_228._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)11>_> *)(local_228 + 8),
               (VkQueryPool)local_228._0_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar3 = getSafeObjectCount((Context *)**(undefined8 **)this,sVar4 - sVar3,0);
  __n = 0x4000;
  if (sVar3 < 0x4000) {
    __n = sVar3;
  }
  local_1e0 = Context::getDeviceInterface((Context *)this);
  local_1e8 = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
            *)local_228,__n,(allocator_type *)local_1b0);
  local_1b0 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)11>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18));
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar3 != 0) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      pdVar6 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0xb;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0].pfnReallocation._0_4_ = (deUint32)local_1d8;
      local_1a8[0].pfnAllocation._4_4_ = (VkQueryType)context;
      local_1a8[0].pfnReallocation._4_4_ = params.queryType;
      ::vk::createQueryPool
                ((Move<vk::Handle<(vk::HandleType)11>_> *)&local_208,local_1e0,local_1e8,
                 (VkQueryPoolCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
      pdVar6[2] = (deUint64)DStack_200.m_device;
      pdVar6[3] = (deUint64)DStack_200.m_allocator;
      *pdVar6 = local_208.m_internal;
      pdVar6[1] = (deUint64)DStack_200.m_deviceIface;
      local_208.m_internal = 0;
      DStack_200.m_deviceIface = (DeviceInterface *)0x0;
      DStack_200.m_device = (VkDevice)0x0;
      DStack_200.m_allocator = (VkAllocationCallbacks *)0x0;
      plVar7 = (long *)operator_new(0x20);
      uVar2 = local_228._0_8_;
      *(undefined4 *)(plVar7 + 1) = 0;
      *(undefined4 *)((long)plVar7 + 0xc) = 0;
      *plVar7 = (long)&PTR__SharedPtrState_00cef2b0;
      plVar7[2] = (long)pdVar6;
      *(undefined4 *)(plVar7 + 1) = 1;
      *(undefined4 *)((long)plVar7 + 0xc) = 1;
      plVar1 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)local_228._0_8_ + lVar9)
      ;
      if (plVar1 != plVar7) {
        if (plVar1 != (long *)0x0) {
          LOCK();
          plVar1 = plVar1 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            *(undefined8 *)(local_228._0_8_ + lVar9 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)
                                           local_228._0_8_ + lVar9) + 0x10))();
          }
          LOCK();
          piVar8 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar2 + lVar9
                                    ) + 0xc);
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar1 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar2 + lVar9);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar2 + lVar9) = 0;
          }
        }
        *(deUint64 **)(uVar2 + lVar9 + -8) = pdVar6;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar2 + lVar9) = plVar7;
        LOCK();
        *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
        UNLOCK();
        LOCK();
        piVar8 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar2 + lVar9)
                        + 0xc);
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      plVar1 = plVar7 + 1;
      LOCK();
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
      }
      piVar8 = (int *)((long)plVar7 + 0xc);
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      if (local_208.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
                  (&DStack_200,(VkQueryPool)local_208.m_internal);
      }
      if ((uVar10 & 0x3ff) == 0 && uVar10 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (__n != uVar10);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
                     *)local_228,(pointer)local_228._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkQueryPoolCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
             *)local_228);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}